

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryElement.cpp
# Opt level: O3

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::GeometryElement::childElementForName(GeometryElement *this,string *name)

{
  int iVar1;
  XMLParserState *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<iDynTree::XMLElement> sVar3;
  undefined1 local_a1;
  string *local_a0;
  undefined8 local_98;
  code *local_90;
  code *local_88;
  string *local_80;
  undefined8 local_78;
  code *local_70;
  code *local_68;
  string *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  string *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  
  __args = (XMLParserState *)iDynTree::XMLElement::getParserState();
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::XMLElement,std::allocator<iDynTree::XMLElement>,iDynTree::XMLParserState&,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x8,(XMLElement **)this,
             (allocator<iDynTree::XMLElement> *)&local_a1,__args,in_RDX);
  iVar1 = std::__cxx11::string::compare((char *)in_RDX);
  if (iVar1 == 0) {
    local_38 = 0;
    local_28 = std::
               _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:26:43)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:26:43)>
               ::_M_manager;
    local_40 = name;
    iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this);
    _Var2._M_pi = extraout_RDX_02;
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,3);
      _Var2._M_pi = extraout_RDX_03;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)in_RDX);
    if (iVar1 == 0) {
      local_58 = 0;
      local_48 = std::
                 _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:48:43)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:48:43)>
                 ::_M_manager;
      local_60 = name;
      iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this);
      _Var2._M_pi = extraout_RDX_04;
      if (local_50 != (code *)0x0) {
        (*local_50)(&local_60,&local_60,3);
        _Var2._M_pi = extraout_RDX_05;
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)in_RDX);
      if (iVar1 == 0) {
        local_78 = 0;
        local_68 = std::
                   _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:78:43)>
                   ::_M_invoke;
        local_70 = std::
                   _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:78:43)>
                   ::_M_manager;
        local_80 = name;
        iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this);
        _Var2._M_pi = extraout_RDX_06;
        if (local_70 != (code *)0x0) {
          (*local_70)(&local_80,&local_80,3);
          _Var2._M_pi = extraout_RDX_07;
        }
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)in_RDX);
        _Var2._M_pi = extraout_RDX;
        if (iVar1 == 0) {
          local_98 = 0;
          local_88 = std::
                     _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:98:43)>
                     ::_M_invoke;
          local_90 = std::
                     _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:98:43)>
                     ::_M_manager;
          local_a0 = name;
          iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this);
          _Var2._M_pi = extraout_RDX_00;
          if (local_90 != (code *)0x0) {
            (*local_90)(&local_a0,&local_a0,3);
            _Var2._M_pi = extraout_RDX_01;
          }
        }
      }
    }
  }
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_XMLElement;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> GeometryElement::childElementForName(const std::string& name)
    {
        std::shared_ptr<XMLElement> element = std::make_shared<XMLElement>(
            getParserState(), name);
        if (name == "box") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute>> &attributes){

                auto found = attributes.find("size");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::box", "Missing 'size' attribute for box geometry.");
                    return false;
                }
                Vector3 boxDimensionn;
                if (!vector3FromString(found->second->value(), boxDimensionn)) {

                    return false;
                }
                Box *box = new Box();

                box->setX(boxDimensionn(0));
                box->setY(boxDimensionn(1));
                box->setZ(boxDimensionn(2));

                m_shape = std::shared_ptr<SolidShape>(box);
                return true;
            });
        } else if (name == "cylinder") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                double radius, length;
                auto found = attributes.find("radius");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Missing 'radius' attribute for cylinder geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), radius)) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Failed to parse 'radius' attribute for cylinder geometry.");
                    return false;
                }

                found = attributes.find("length");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Missing 'length' attribute for cylinder geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), length)) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Failed to parse 'length' attribute for cylinder geometry.");
                    return false;
                }
                Cylinder * cylinder = new Cylinder();
                cylinder->setRadius(radius);
                cylinder->setLength(length);

                m_shape = std::shared_ptr<Cylinder>(cylinder);
                return true;
            });
        } else if (name == "sphere") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                double radius;
                auto found = attributes.find("radius");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::sphere", "Missing 'radius' attribute for sphere geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), radius)) {
                    reportError("GeometryElement", "childElementForName::sphere", "Failed to parse 'radius' attribute for sphere geometry.");
                    return false;
                }

                Sphere * sphere = new Sphere();
                sphere->setRadius(radius);

                m_shape = std::shared_ptr<Sphere>(sphere);
                return true;
            });
        } else if (name == "mesh") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                auto found = attributes.find("filename");
                if (found == attributes.end()) {
                    reportWarning("GeometryElement", "childElementForName::mesh", "Missing 'filename' attribute for sphere mesh.");
                } else {
                    //TODO: Do not fail (?)
                    // For now we just support urdf with local meshes, see as an example
                    // https://github.com/bulletphysics/bullet3/tree/master/data
                    ExternalMesh * externalMesh = new ExternalMesh();
                    externalMesh->setFilename(found->second->value());
                    externalMesh->setPackageDirs(this->packageDirs);
                    //                    pExternalMesh->filename = getURDFMeshAbsolutePathFilename(urdf_filename,localName);
                    iDynTree::Vector3 scale;
                    scale(0) = scale(1) = scale(2) = 1.0;

                    found = attributes.find("scale");
                    if (found != attributes.end()) {
                        vector3FromString(found->second->value(), scale);
                    }
                    externalMesh->setScale(scale);
                    m_shape = std::shared_ptr<ExternalMesh>(externalMesh);
                }
                return true;
            });
        }
        return element;
    }